

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

char * ucnv_getCanonicalName_63(char *alias,char *standard,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  UBool UVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  UErrorCode UVar13;
  uint32_t uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  char *dst;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  uint32_t convStart;
  char local_78 [72];
  
  UVar5 = haveAliasData(pErrorCode);
  if (UVar5 == '\0') {
    return (char *)0x0;
  }
  if (alias == (char *)0x0) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (char *)0x0;
  }
  if (*alias == '\0') {
    return (char *)0x0;
  }
  uVar6 = getTagNumber(standard);
  uVar1 = (gMainTable.optionTable)->stringNormalizationType;
  dst = alias;
  if (uVar1 == 0) {
LAB_0016520b:
    puVar4 = gMainTable.normalizedStringTable;
    puVar3 = gMainTable.stringTable;
    puVar2 = gMainTable.aliasList;
    uVar8 = 0;
    uVar14 = gMainTable.untaggedConvArraySize;
    uVar16 = gMainTable.untaggedConvArraySize >> 1;
    do {
      if (uVar1 == 0) {
        iVar9 = ucnv_compareNames_63(dst,(char *)(puVar3 + puVar2[uVar16]));
      }
      else {
        iVar9 = strcmp(dst,(char *)(puVar4 + puVar2[uVar16]));
      }
      uVar7 = uVar16;
      if ((-1 < iVar9) && (uVar7 = uVar14, uVar8 = uVar16, iVar9 == 0)) {
        UVar13 = U_AMBIGUOUS_ALIAS_WARNING;
        if (-1 < (short)gMainTable.untaggedConvArray[uVar16]) {
          UVar13 = U_ZERO_ERROR;
        }
        uVar18 = (ulong)(gMainTable.untaggedConvArray[uVar16] & 0xfff);
        goto LAB_001652d2;
      }
      uVar14 = uVar7;
      uVar7 = uVar14 + uVar8 >> 1;
      bVar19 = uVar16 != uVar7;
      uVar16 = uVar7;
    } while (bVar19);
    uVar18 = 0xffffffff;
    UVar13 = U_ZERO_ERROR;
  }
  else {
    sVar10 = strlen(alias);
    if (sVar10 < 0x3c) {
      dst = local_78;
      ucnv_io_stripASCIIForCompare_63(dst,alias);
      goto LAB_0016520b;
    }
    uVar18 = 0xffffffff;
    UVar13 = U_BUFFER_OVERFLOW_ERROR;
  }
LAB_001652d2:
  uVar16 = (uint)uVar18;
  if (UVar13 != U_ZERO_ERROR) {
    *pErrorCode = UVar13;
  }
  uVar14 = gMainTable.converterListSize;
  puVar4 = gMainTable.stringTable;
  puVar3 = gMainTable.taggedAliasLists;
  puVar2 = gMainTable.taggedAliasArray;
  if ((uVar6 < gMainTable.tagListSize - 1) && (uVar16 < gMainTable.converterListSize)) {
    uVar8 = gMainTable.converterListSize * uVar6;
    uVar11 = (ulong)gMainTable.taggedAliasArray[uVar8 + uVar16];
    if (uVar11 != 0) {
      uVar15 = (ulong)gMainTable.taggedAliasLists[uVar11];
      bVar19 = uVar15 != 0;
      if (bVar19) {
        bVar19 = true;
        uVar17 = 1;
        do {
          if (((ulong)puVar3[uVar11 + uVar17] != 0) &&
             (iVar9 = ucnv_compareNames_63(alias,(char *)(puVar4 + puVar3[uVar11 + uVar17])),
             iVar9 == 0)) break;
          bVar19 = uVar17 < uVar15;
          bVar20 = uVar17 != uVar15;
          uVar17 = uVar17 + 1;
        } while (bVar20);
      }
      if (bVar19) goto LAB_001654a6;
    }
    puVar4 = gMainTable.stringTable;
    puVar3 = gMainTable.taggedAliasLists;
    if (UVar13 == U_AMBIGUOUS_ALIAS_WARNING) {
      uVar16 = uVar14 * (uVar6 + 1);
      bVar19 = uVar8 < uVar16;
      if (bVar19) {
        bVar19 = true;
        uVar18 = (ulong)uVar8;
        do {
          uVar11 = (ulong)puVar2[uVar18];
          if (uVar11 != 0) {
            uVar15 = (ulong)puVar3[uVar11];
            bVar20 = uVar15 != 0;
            if (bVar20) {
              bVar20 = true;
              uVar17 = 1;
              do {
                uVar12 = (ulong)puVar3[uVar11 + uVar17];
                if ((uVar12 != 0) &&
                   (iVar9 = ucnv_compareNames_63(alias,(char *)(puVar4 + uVar12)), iVar9 == 0))
                break;
                bVar20 = uVar17 < uVar15;
                bVar21 = uVar17 != uVar15;
                uVar17 = uVar17 + 1;
              } while (bVar21);
            }
            if (bVar20) {
              uVar18 = (ulong)((int)uVar18 - uVar8);
              break;
            }
          }
          uVar18 = uVar18 + 1;
          bVar19 = uVar18 < uVar16;
        } while (uVar18 != uVar16);
      }
      uVar16 = (uint)uVar18;
      if (bVar19) goto LAB_001654a6;
    }
  }
  uVar16 = 0xffffffff;
LAB_001654a6:
  if (gMainTable.converterListSize <= uVar16) {
    return (char *)0x0;
  }
  return (char *)((ulong)((uint)gMainTable.converterList[uVar16] * 2) + (long)gMainTable.stringTable
                 );
}

Assistant:

U_CAPI const char * U_EXPORT2
ucnv_getCanonicalName(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    if (haveAliasData(pErrorCode) && isAlias(alias, pErrorCode)) {
        uint32_t convNum = findTaggedConverterNum(alias, standard, pErrorCode);

        if (convNum < gMainTable.converterListSize) {
            return GET_STRING(gMainTable.converterList[convNum]);
        }
    }

    return NULL;
}